

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_fail_conn(nn_sws *self,int code,char *reason)

{
  uint8_t *buf;
  char *in_RDX;
  uint16_t in_SI;
  long in_RDI;
  nn_iovec iov;
  uint8_t *payload_pos;
  uint8_t rand_mask [4];
  size_t payload_len;
  size_t reason_len;
  nn_fsm_event *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iovcnt;
  size_t in_stack_ffffffffffffffb8;
  nn_list *in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  ulong local_28;
  size_t local_20;
  char *local_18;
  uint16_t local_c;
  long local_8;
  
  local_8 = in_RDI;
  if (*(int *)(in_RDI + 0x58) != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(local_8 + 0x58),
            "NN_SWS_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x2fd);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined4 *)(in_RDI + 0x1620) = 7;
  local_18 = in_RDX;
  local_c = in_SI;
  nn_pipebase_stop((nn_pipebase *)0x15a21a);
  nn_msg_array_term(in_stack_ffffffffffffffc0);
  local_20 = strlen(local_18);
  local_28 = local_20 + 2;
  if (0x7d < local_28) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","payload_len <= NN_SWS_PAYLOAD_MAX_LENGTH",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x30b);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined1 *)(local_8 + 0x171a) = 0x88;
  *(undefined1 *)(local_8 + 0x171b) = (undefined1)local_28;
  *(undefined8 *)(local_8 + 0x1798) = 2;
  iovcnt = *(int *)(local_8 + 0x60);
  if (iovcnt == 1) {
    *(byte *)(local_8 + 0x171b) = *(byte *)(local_8 + 0x171b) | 0x80;
    nn_random_generate(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(undefined4 *)(local_8 + 0x171c) = local_2c;
    *(long *)(local_8 + 0x1798) = *(long *)(local_8 + 0x1798) + 4;
  }
  else {
    if (iovcnt != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x326);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined1 *)(local_8 + 0x171b) = *(undefined1 *)(local_8 + 0x171b);
  }
  buf = (uint8_t *)(local_8 + 0x171a + *(long *)(local_8 + 0x1798));
  nn_puts(buf,local_c);
  *(long *)(local_8 + 0x1798) = *(long *)(local_8 + 0x1798) + 2;
  memcpy(buf + 2,local_18,local_20);
  *(size_t *)(local_8 + 0x1798) = local_20 + *(long *)(local_8 + 0x1798);
  if (*(int *)(local_8 + 0x60) == 1) {
    nn_sws_mask_payload(buf,local_28,(uint8_t *)&local_2c,4,(int *)0x0);
  }
  if (*(int *)(local_8 + 0x17a0) == 1) {
    nn_usock_send(*(nn_usock **)(local_8 + 0x1798),(nn_iovec *)(local_8 + 0x171a),iovcnt);
    *(undefined4 *)(local_8 + 0x17a0) = 2;
    *(undefined4 *)(local_8 + 0x58) = 5;
  }
  else {
    *(undefined4 *)(local_8 + 0x58) = 7;
    nn_fsm_raise((nn_fsm *)CONCAT44(iovcnt,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,0);
  }
  return;
}

Assistant:

static void nn_sws_fail_conn (struct nn_sws *self, int code, char *reason)
{
    size_t reason_len;
    size_t payload_len;
    uint8_t rand_mask [NN_SWS_FRAME_SIZE_MASK];
    uint8_t *payload_pos;
    struct nn_iovec iov;

    nn_assert_state (self, NN_SWS_STATE_ACTIVE);

    /*  Stop user send/recv actions. */
    self->instate = NN_SWS_INSTATE_CLOSED;
    nn_pipebase_stop (&self->pipebase);

    /*  Destroy any remnant incoming message fragments. */
    nn_msg_array_term (&self->inmsg_array);

    reason_len = strlen (reason);

    payload_len = reason_len + NN_SWS_CLOSE_CODE_LEN;

    /*  Ensure text is short enough to also include code and framing. */
    nn_assert (payload_len <= NN_SWS_PAYLOAD_MAX_LENGTH);

    /*  RFC 6455 section 5.5.1. */
    self->fail_msg [0] = (char)(NN_SWS_FRAME_BITMASK_FIN | NN_WS_OPCODE_CLOSE);

    /*  Size of the payload, which is the status code plus the reason. */
    self->fail_msg [1] = (char)payload_len;

    self->fail_msg_len = NN_SWS_FRAME_SIZE_INITIAL;

    switch (self->mode) {
    case NN_WS_SERVER:
        self->fail_msg [1] |= NN_SWS_FRAME_BITMASK_NOT_MASKED;
        break;
    case NN_WS_CLIENT:
        self->fail_msg [1] |= NN_SWS_FRAME_BITMASK_MASKED;

        /*  Generate 32-bit mask as per RFC 6455 5.3. */
        nn_random_generate (rand_mask, NN_SWS_FRAME_SIZE_MASK);

        memcpy (&self->fail_msg [NN_SWS_FRAME_SIZE_INITIAL],
            rand_mask, NN_SWS_FRAME_SIZE_MASK);

        self->fail_msg_len += NN_SWS_FRAME_SIZE_MASK;
        break;
    default:
        /*  Developer error. */
        nn_assert (0);
    }

    payload_pos = (uint8_t*) (&self->fail_msg [self->fail_msg_len]);

    /*  Copy Status Code in network order (big-endian). */
    nn_puts (payload_pos, (uint16_t) code);
    self->fail_msg_len += NN_SWS_CLOSE_CODE_LEN;

    /*  Copy Close Reason immediately following the code. */
    memcpy (payload_pos + NN_SWS_CLOSE_CODE_LEN, reason, reason_len);
    self->fail_msg_len += reason_len;

    /*  If this is a client, apply mask. */
    if (self->mode == NN_WS_CLIENT) {
        nn_sws_mask_payload (payload_pos, payload_len,
            rand_mask, NN_SWS_FRAME_SIZE_MASK, NULL);
    }


    if (self->outstate == NN_SWS_OUTSTATE_IDLE) {
        iov.iov_base = self->fail_msg;
        iov.iov_len = self->fail_msg_len;
        nn_usock_send (self->usock, &iov, 1);
        self->outstate = NN_SWS_OUTSTATE_SENDING;
        self->state = NN_SWS_STATE_CLOSING_CONNECTION;
    } else {
        self->state = NN_SWS_STATE_DONE;
        nn_fsm_raise (&self->fsm, &self->done, NN_SWS_RETURN_CLOSE_HANDSHAKE);
    }

    return;
}